

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

Result __thiscall
wabt::interp::Memory::AtomicRmwCmpxchg<unsigned_short>
          (Memory *this,u64 offset,u64 addend,unsigned_short expect,unsigned_short replace,
          unsigned_short *out)

{
  Result RVar1;
  Enum EVar2;
  unsigned_short read;
  unsigned_short *local_38;
  
  local_38 = out;
  RVar1 = AtomicLoad<unsigned_short>(this,offset,addend,&read);
  EVar2 = Error;
  if ((RVar1.enum_ != Error) &&
     ((read != expect ||
      (RVar1 = AtomicStore<unsigned_short>(this,offset,addend,replace), RVar1.enum_ != Error)))) {
    *local_38 = read;
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

Result Memory::AtomicRmwCmpxchg(u64 offset,
                                u64 addend,
                                T expect,
                                T replace,
                                T* out) {
  T read;
  CHECK_RESULT(AtomicLoad(offset, addend, &read));
  if (read == expect) {
    CHECK_RESULT(AtomicStore(offset, addend, replace));
  }
  *out = read;
  return Result::Ok;
}